

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_file_stat_internal
                  (mz_zip_archive *pZip,mz_uint file_index,mz_uint8 *pCentral_dir_header,
                  mz_zip_archive_file_stat *pStat,mz_bool *pFound_zip64_extra_data)

{
  undefined8 uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  mz_bool mVar7;
  time_t tVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  short *psVar12;
  mz_uint64 *pmVar13;
  tm local_68;
  
  if (pFound_zip64_extra_data != (mz_bool *)0x0) {
    *pFound_zip64_extra_data = 0;
  }
  if (pCentral_dir_header == (mz_uint8 *)0x0 || pStat == (mz_zip_archive_file_stat *)0x0) {
    mVar7 = 0;
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
  }
  else {
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs =
         (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + (ulong)file_index * 4)
    ;
    pStat->m_version_made_by = *(mz_uint16 *)(pCentral_dir_header + 4);
    pStat->m_version_needed = *(mz_uint16 *)(pCentral_dir_header + 6);
    pStat->m_bit_flag = *(mz_uint16 *)(pCentral_dir_header + 8);
    pStat->m_method = *(mz_uint16 *)(pCentral_dir_header + 10);
    uVar2 = *(ushort *)(pCentral_dir_header + 0xc);
    uVar3 = *(ushort *)(pCentral_dir_header + 0xe);
    local_68.tm_wday = 0;
    local_68.tm_yday = 0;
    local_68.tm_gmtoff = 0;
    local_68.tm_zone = (char *)0x0;
    local_68.tm_isdst = -1;
    local_68._36_4_ = 0;
    local_68.tm_year = (uVar3 >> 9) + 0x50;
    local_68.tm_mon = (uVar3 >> 5 & 0xf) - 1;
    local_68.tm_mday = uVar3 & 0x1f;
    local_68.tm_hour = (int)(uVar2 >> 0xb);
    local_68.tm_min = uVar2 >> 5 & 0x3f;
    local_68.tm_sec = (uint)uVar2 * 2 & 0x3e;
    tVar8 = mktime(&local_68);
    pStat->m_time = tVar8;
    pStat->m_crc32 = *(mz_uint32 *)(pCentral_dir_header + 0x10);
    uVar1 = *(undefined8 *)(pCentral_dir_header + 0x14);
    *(int *)&pStat->m_comp_size = (int)uVar1;
    *(undefined4 *)((long)&pStat->m_comp_size + 4) = 0;
    *(int *)&pStat->m_uncomp_size = (int)((ulong)uVar1 >> 0x20);
    *(undefined4 *)((long)&pStat->m_uncomp_size + 4) = 0;
    pStat->m_internal_attr = *(mz_uint16 *)(pCentral_dir_header + 0x24);
    pStat->m_external_attr = *(mz_uint32 *)(pCentral_dir_header + 0x26);
    pStat->m_local_header_ofs = (ulong)*(uint *)(pCentral_dir_header + 0x2a);
    uVar11 = (uint)*(ushort *)(pCentral_dir_header + 0x1c);
    if (0x1fe < *(ushort *)(pCentral_dir_header + 0x1c)) {
      uVar11 = 0x1ff;
    }
    memcpy(pStat->m_filename,pCentral_dir_header + 0x2e,(ulong)uVar11);
    pStat->m_filename[uVar11] = '\0';
    uVar11 = 0x1ff;
    if (*(ushort *)(pCentral_dir_header + 0x20) < 0x1ff) {
      uVar11 = (uint)*(ushort *)(pCentral_dir_header + 0x20);
    }
    pStat->m_comment_size = uVar11;
    memcpy(pStat->m_comment,
           pCentral_dir_header +
           (ulong)*(ushort *)(pCentral_dir_header + 0x1e) +
           (ulong)*(ushort *)(pCentral_dir_header + 0x1c) + 0x2e,(ulong)uVar11);
    pStat->m_comment[uVar11] = '\0';
    mVar7 = mz_zip_reader_is_file_a_directory(pZip,file_index);
    pStat->m_is_directory = mVar7;
    mVar7 = mz_zip_reader_is_file_encrypted(pZip,file_index);
    pStat->m_is_encrypted = mVar7;
    mVar7 = mz_zip_reader_is_file_supported(pZip,file_index);
    pStat->m_is_supported = mVar7;
    uVar4 = pStat->m_comp_size;
    uVar5 = pStat->m_uncomp_size;
    uVar10 = uVar5;
    if (uVar5 < uVar4) {
      uVar10 = uVar4;
    }
    uVar6 = pStat->m_local_header_ofs;
    if (uVar10 <= uVar6) {
      uVar10 = uVar6;
    }
    mVar7 = 1;
    if ((uVar10 == 0xffffffff) &&
       (uVar11 = (uint)*(ushort *)(pCentral_dir_header + 0x1e),
       *(ushort *)(pCentral_dir_header + 0x1e) != 0)) {
      psVar12 = (short *)(pCentral_dir_header + 0x2e + *(ushort *)(pCentral_dir_header + 0x1c));
      while (3 < uVar11) {
        uVar2 = psVar12[1];
        uVar9 = (uint)uVar2;
        if ((ulong)uVar11 < (ulong)uVar2 + 4) break;
        if (*psVar12 == 1) {
          if (pFound_zip64_extra_data != (mz_bool *)0x0) {
            *pFound_zip64_extra_data = 1;
          }
          if (uVar5 == 0xffffffff) {
            if (uVar2 < 8) break;
            pStat->m_uncomp_size = *(mz_uint64 *)(psVar12 + 2);
            pmVar13 = (mz_uint64 *)(psVar12 + 6);
            uVar9 = uVar2 - 8;
          }
          else {
            pmVar13 = (mz_uint64 *)(psVar12 + 2);
          }
          if (uVar4 == 0xffffffff) {
            if (uVar9 < 8) break;
            pStat->m_comp_size = *pmVar13;
            pmVar13 = pmVar13 + 1;
            uVar9 = uVar9 - 8;
          }
          if (uVar6 != 0xffffffff) {
            return 1;
          }
          if (7 < uVar9) {
            pStat->m_local_header_ofs = *pmVar13;
            return 1;
          }
          break;
        }
        psVar12 = (short *)((long)psVar12 + (ulong)uVar2 + 4);
        uVar11 = (uVar11 - uVar2) - 4;
        if (uVar11 == 0) {
          return 1;
        }
      }
      mVar7 = 0;
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
      }
    }
  }
  return mVar7;
}

Assistant:

static mz_bool mz_zip_file_stat_internal(mz_zip_archive *pZip, mz_uint file_index, const mz_uint8 *pCentral_dir_header, mz_zip_archive_file_stat *pStat, mz_bool *pFound_zip64_extra_data)
{
    mz_uint n;
    const mz_uint8 *p = pCentral_dir_header;

    if (pFound_zip64_extra_data)
        *pFound_zip64_extra_data = MZ_FALSE;

    if ((!p) || (!pStat))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Extract fields from the central directory record. */
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
    pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
    pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
    pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
    pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
    pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS), MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
    pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
    pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
    pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
    pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
    pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

    /* Copy as much of the filename and comment as possible. */
    n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
    memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pStat->m_filename[n] = '\0';

    n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
    pStat->m_comment_size = n;
    memcpy(pStat->m_comment, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS), n);
    pStat->m_comment[n] = '\0';

    /* Set some flags for convienance */
    pStat->m_is_directory = mz_zip_reader_is_file_a_directory(pZip, file_index);
    pStat->m_is_encrypted = mz_zip_reader_is_file_encrypted(pZip, file_index);
    pStat->m_is_supported = mz_zip_reader_is_file_supported(pZip, file_index);

    /* See if we need to read any zip64 extended information fields. */
    /* Confusingly, these zip64 fields can be present even on non-zip64 archives (Debian zip on a huge files from stdin piped to stdout creates them). */
    if (MZ_MAX(MZ_MAX(pStat->m_comp_size, pStat->m_uncomp_size), pStat->m_local_header_ofs) == MZ_UINT32_MAX)
    {
        /* Attempt to find zip64 extended information field in the entry's extra data */
        mz_uint32 extra_size_remaining = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

        if (extra_size_remaining)
        {
            const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);

            do
            {
                mz_uint32 field_id;
                mz_uint32 field_data_size;

                if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                field_id = MZ_READ_LE16(pExtra_data);
                field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                {
                    const mz_uint8 *pField_data = pExtra_data + sizeof(mz_uint16) * 2;
                    mz_uint32 field_data_remaining = field_data_size;

                    if (pFound_zip64_extra_data)
                        *pFound_zip64_extra_data = MZ_TRUE;

                    if (pStat->m_uncomp_size == MZ_UINT32_MAX)
                    {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_uncomp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_comp_size == MZ_UINT32_MAX)
                    {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_comp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_local_header_ofs == MZ_UINT32_MAX)
                    {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_local_header_ofs = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    break;
                }

                pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
            } while (extra_size_remaining);
        }
    }

    return MZ_TRUE;
}